

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O0

void __thiscall MxxSort_SampleSortInbalanced_Test::TestBody(MxxSort_SampleSortInbalanced_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  reference pvVar8;
  reference pvVar9;
  comm *in_R8;
  char *in_R9;
  AssertHelper local_208;
  Message local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_2;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  size_t i;
  Message local_1b8;
  size_type_conflict local_1b0;
  size_type_conflict local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_170;
  Message local_168 [2];
  pair<int,_int> *local_158;
  pair<int,_int> *local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__1;
  string local_130;
  AssertHelper local_110;
  Message local_108 [2];
  pair<int,_int> *local_f8;
  pair<int,_int> *local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> allsorted;
  undefined1 local_90 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> truth;
  anon_class_1_0_00000001 paircmp;
  allocator<std::pair<int,_int>_> local_59;
  undefined1 local_58 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> vec;
  undefined1 local_30 [8];
  comm c;
  MxxSort_SampleSortInbalanced_Test *this_local;
  
  c._24_8_ = this;
  mxx::comm::comm((comm *)local_30);
  iVar3 = mxx::comm::rank((comm *)local_30);
  srand(iVar3 * 0xd);
  iVar3 = mxx::comm::rank((comm *)local_30);
  std::allocator<std::pair<int,_int>_>::allocator(&local_59);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_58,
             (long)(iVar3 * 3 + 10),&local_59);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_59);
  iVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_58)
  ;
  iVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_58)
  ;
  std::
  generate<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__0>
            (iVar4._M_current,iVar5._M_current);
  mxx::gatherv<std::pair<int,int>>
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90,
             (mxx *)local_58,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0,(int)local_30
             ,in_R8);
  iVar3 = mxx::comm::rank((comm *)local_30);
  if (iVar3 == 0) {
    iVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       local_90);
    iVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       local_90);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
              (iVar4._M_current,iVar5._M_current);
  }
  iVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_58)
  ;
  iVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_58)
  ;
  mxx::
  sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
            (iVar4._M_current,iVar5._M_current,local_30);
  mxx::gatherv<std::pair<int,int>>
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &gtest_ar_.message_,(mxx *)local_58,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0,(int)local_30
             ,in_R8);
  local_f0 = (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_58);
  local_f8 = (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_58);
  bVar2 = std::
          is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
                    (local_f0,local_f8);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_e8,bVar2);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,(internal *)local_e8,
               (AssertionResult *)"std::is_sorted(vec.begin(), vec.end(), paircmp)","false","true",
               in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
               ,0x4e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    testing::Message::~Message(local_108);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    local_150 = (pair<int,_int> *)
                std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           local_58);
    local_158 = (pair<int,_int> *)
                std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           local_58);
    bVar2 = mxx::
            is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
                      (local_150,local_158,local_30);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_148,bVar2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar2) {
      testing::Message::Message(local_168);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_148,
                 (AssertionResult *)"mxx::is_sorted(vec.begin(), vec.end(), paircmp, c)","false",
                 "true",in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                 ,0x50,pcVar6);
      testing::internal::AssertHelper::operator=(&local_170,local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(local_168);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      iVar3 = mxx::comm::rank((comm *)local_30);
      if (iVar3 == 0) {
        local_1a8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )local_90);
        local_1b0 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )&gtest_ar_.message_);
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_1a0,"truth.size()","allsorted.size()",&local_1a8,
                   &local_1b0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
        if (!bVar2) {
          testing::Message::Message(&local_1b8);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                     ,0x54,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_1b8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
          testing::Message::~Message(&local_1b8);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
        if (gtest_ar__1.message_.ptr_._4_4_ != 0) goto LAB_00167259;
        for (gtest_ar_1.message_.ptr_ =
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            sVar1.ptr_ = gtest_ar_1.message_.ptr_,
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                               ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)local_90), sVar1.ptr_ < pbVar7;
            gtest_ar_1.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(gtest_ar_1.message_.ptr_)->field_0x1) {
          pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              local_90,(size_type_conflict)gtest_ar_1.message_.ptr_);
          pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &gtest_ar_.message_,(size_type_conflict)gtest_ar_1.message_.ptr_);
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_1d8,"truth[i].first","allsorted[i].first",
                     &pvVar8->first,&pvVar9->first);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
          if (!bVar2) {
            testing::Message::Message(&local_1e0);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                       ,0x56,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_1e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_1e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
          pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              local_90,(size_type_conflict)gtest_ar_1.message_.ptr_);
          pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &gtest_ar_.message_,(size_type_conflict)gtest_ar_1.message_.ptr_);
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_1f8,"truth[i].second","allsorted[i].second",
                     &pvVar8->second,&pvVar9->second);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
          if (!bVar2) {
            testing::Message::Message(&local_200);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_208,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                       ,0x57,pcVar6);
            testing::internal::AssertHelper::operator=(&local_208,&local_200);
            testing::internal::AssertHelper::~AssertHelper(&local_208);
            testing::Message::~Message(&local_200);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        }
      }
      gtest_ar__1.message_.ptr_._4_4_ = 0;
    }
  }
LAB_00167259:
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &gtest_ar_.message_);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_58);
  mxx::comm::~comm((comm *)local_30);
  return;
}

Assistant:

TEST(MxxSort, SampleSortInbalanced) {
    mxx::comm c;
    srand(c.rank()*13);
    std::vector<std::pair<int,int> > vec(10 + c.rank()*3);

    std::generate(vec.begin(), vec.end(), [](){return std::make_pair(std::rand(), std::rand());});

    // comparator for sorting
    auto paircmp = [](const std::pair<int,int>& x, const std::pair<int, int>& y){
        return x.first < y.first || (x.first == y.first && x.second < y.second);
    };

    // send all elements to master and sort there as "groud-truth"
    std::vector<std::pair<int, int>> truth = mxx::gatherv(vec, 0, c);
    if (c.rank() == 0)
        std::sort(truth.begin(), truth.end(), paircmp);

    // distributed sort
    mxx::sort(vec.begin(), vec.end(), paircmp, c);

    // send to rank 0
    std::vector<std::pair<int,int>> allsorted = mxx::gatherv(vec, 0, c);

    // should be sorted locally
    ASSERT_TRUE(std::is_sorted(vec.begin(), vec.end(), paircmp));
    // should be sorted globally
    ASSERT_TRUE(mxx::is_sorted(vec.begin(), vec.end(), paircmp, c));

    // on rank 0, vectors should be the same
    if (c.rank() == 0) {
        ASSERT_EQ(truth.size(), allsorted.size());
        for (size_t i = 0; i < truth.size(); ++i) {
            EXPECT_EQ(truth[i].first, allsorted[i].first);
            EXPECT_EQ(truth[i].second, allsorted[i].second);
        }
    }
}